

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zoombox.c
# Opt level: O2

void zoombox(tgestate_t *state)

{
  uint uVar1;
  zxspectrum_t *pzVar2;
  uint uVar3;
  attribute_t aVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  byte bVar8;
  char cVar9;
  uint8_t uVar10;
  byte bVar11;
  uint8_t uVar12;
  uint8_t *__dest;
  uint8_t *puVar13;
  int iVar14;
  ulong __n;
  int iVar15;
  uint8_t *puVar16;
  int iVar17;
  long lVar18;
  int local_40;
  
  (state->zoombox).x = '\f';
  (state->zoombox).y = '\b';
  aVar4 = choose_game_window_attributes(state);
  (state->speccy->screen).attributes[(long)state->width * 9 + 0x12] = aVar4;
  (state->speccy->screen).attributes[(long)state->width * 9 + 0x13] = aVar4;
  (state->speccy->screen).attributes[(long)state->width * 10 + 0x12] = aVar4;
  (state->speccy->screen).attributes[(long)state->width * 10 + 0x13] = aVar4;
  (state->zoombox).width = '\0';
  (state->zoombox).height = '\0';
  do {
    (*state->speccy->stamp)(state->speccy);
    uVar10 = (state->zoombox).x;
    bVar5 = (state->zoombox).width;
    bVar8 = 1;
    if (uVar10 != '\x01') {
      bVar8 = uVar10 - 1;
      (state->zoombox).x = bVar8;
      bVar5 = bVar5 + 1;
      (state->zoombox).width = bVar5;
    }
    if ((byte)(bVar5 + bVar8) < 0x16) {
      bVar5 = bVar5 + 1;
      (state->zoombox).width = bVar5;
    }
    uVar10 = (state->zoombox).y;
    uVar12 = (state->zoombox).height;
    bVar11 = 1;
    if (uVar10 != '\x01') {
      bVar11 = uVar10 - 1;
      (state->zoombox).y = bVar11;
      uVar12 = uVar12 + '\x01';
      (state->zoombox).height = uVar12;
    }
    if ((byte)(uVar12 + bVar11) < 0xf) {
      uVar12 = uVar12 + '\x01';
      (state->zoombox).height = uVar12;
    }
    local_40 = (int)state->speccy + 0x30;
    puVar16 = state->window_buf +
              (ulong)((int)state->window_buf_stride * (uint)bVar11 + (uint)bVar8 & 0xffff) + 1;
    puVar13 = (state->speccy->screen).pixels +
              (ulong)bVar8 + (ulong)game_window_start_offsets[(ulong)bVar11 * 8];
    iVar14 = state->columns;
    do {
      cVar9 = -8;
      __dest = puVar13;
      do {
        __n = (ulong)(state->zoombox).width;
        memcpy(__dest,puVar16,__n);
        puVar16 = puVar16 + __n + (byte)((char)iVar14 - bVar5);
        uVar1 = state->width;
        __dest = __dest + (long)(int)uVar1 * 8 + (__n - bVar5);
        cVar9 = cVar9 + '\x01';
      } while (cVar9 != '\0');
      uVar3 = uVar1 + 0x700;
      if ((~((int)puVar13 - local_40) & 0xe0U) != 0) {
        uVar3 = uVar1;
      }
      puVar13 = puVar13 + ((ulong)uVar3 & 0xffff);
      uVar12 = uVar12 + 0xff;
    } while (uVar12 != '\0');
    pzVar2 = state->speccy;
    iVar14 = (int)pzVar2 + 0x30;
    lVar18 = (ulong)(state->zoombox).x +
             (ulong)*(ushort *)("ANOTHER DAY DAWNS" + (ulong)(state->zoombox).y * 0x10 + 10);
    zoombox_draw_tile(state,'\0',(pzVar2->screen).pixels + lVar18 + -1);
    uVar10 = (state->zoombox).width;
    puVar13 = (pzVar2->screen).pixels + lVar18;
    do {
      puVar16 = puVar13 + 1;
      zoombox_draw_tile(state,'\x01',puVar13);
      lVar18 = lVar18 + 1;
      uVar10 = uVar10 + 0xff;
      puVar13 = puVar16;
    } while (uVar10 != '\0');
    zoombox_draw_tile(state,'\x02',puVar16);
    iVar7 = state->width + 0x700;
    if ((~(uint)lVar18 & 0xe0) != 0) {
      iVar7 = state->width;
    }
    puVar16 = puVar16 + iVar7;
    uVar10 = (state->zoombox).height;
    do {
      zoombox_draw_tile(state,'\x03',puVar16);
      iVar15 = (int)puVar16;
      iVar7 = state->width + 0x700;
      if ((~(iVar15 - iVar14) & 0xe0U) != 0) {
        iVar7 = state->width;
      }
      puVar16 = puVar16 + iVar7;
      uVar10 = uVar10 + 0xff;
    } while (uVar10 != '\0');
    zoombox_draw_tile(state,'\x04',puVar16);
    uVar10 = (state->zoombox).width;
    iVar17 = 0;
    puVar13 = puVar16 + -1;
    do {
      puVar16 = puVar13 + -1;
      zoombox_draw_tile(state,'\x01',puVar13);
      iVar17 = iVar17 + 1;
      puVar13 = puVar16;
    } while (uVar10 != (uint8_t)iVar17);
    zoombox_draw_tile(state,'\x05',puVar16);
    iVar6 = 0;
    if (((((iVar15 - (int)pzVar2) + iVar7) - iVar17) - 0x31U & 0xe0) == 0) {
      iVar6 = -0x700;
    }
    puVar16 = puVar16 + (iVar6 - state->width);
    uVar10 = (state->zoombox).height;
    do {
      zoombox_draw_tile(state,'\x03',puVar16);
      iVar7 = -0x700;
      if (((int)puVar16 - iVar14 & 0xe0U) != 0) {
        iVar7 = 0;
      }
      puVar16 = puVar16 + (iVar7 - state->width);
      uVar10 = uVar10 + 0xff;
    } while (uVar10 != '\0');
    invalidate_bitmap(state,(state->speccy->screen).pixels +
                            (ulong)(state->zoombox).x +
                            (ulong)*(ushort *)
                                    ("ANOTHER DAY DAWNS" + (ulong)(state->zoombox).y * 0x10 + 10) +
                            -1,(uint)(state->zoombox).width * 8 + 0x10,
                      (uint)(state->zoombox).height * 8 + 0x10);
    (*state->speccy->sleep)
              (state->speccy,
               (((uint)(state->zoombox).width + (uint)(state->zoombox).height) * 0x1b167) / 0x23);
  } while ((uint)(state->zoombox).width + (uint)(state->zoombox).height < 0x23);
  return;
}

Assistant:

void zoombox(tgestate_t *state)
{
  attribute_t attrs; /* was A */
  uint8_t    *pvar;  /* was HL */
  uint8_t     var;   /* was A */

  assert(state != NULL);

  state->zoombox.x = 12;
  state->zoombox.y = 8;

  attrs = choose_game_window_attributes(state);

  state->speccy->screen.attributes[ 9 * state->width + 18] = attrs;
  state->speccy->screen.attributes[ 9 * state->width + 19] = attrs;
  state->speccy->screen.attributes[10 * state->width + 18] = attrs;
  state->speccy->screen.attributes[10 * state->width + 19] = attrs;

  state->zoombox.width  = 0;
  state->zoombox.height = 0;

  do
  {
    state->speccy->stamp(state->speccy);

    /* Shrink X and grow width until X is 1 */
    pvar = &state->zoombox.x;
    var = *pvar;
    if (var != 1)
    {
      (*pvar)--;
      var--;
      pvar[1]++;
    }

    /* Grow width until it's 22 */
    pvar++; /* -> &state->width */
    var += *pvar;
    if (var < 22)
      (*pvar)++;

    /* Shrink Y and grow height until Y is 1 */
    pvar++; /* -> &state->zoombox.y */
    var = *pvar;
    if (var != 1)
    {
      (*pvar)--;
      var--;
      pvar[1]++;
    }

    /* Grow height until it's 15 */
    pvar++; /* -> &state->height */
    var += *pvar;
    if (var < 15)
      (*pvar)++;

    zoombox_fill(state);
    zoombox_draw_border(state);

    /* Conv: Invalidation added over the original game. */
    invalidate_bitmap(state,
                      &state->speccy->screen.pixels[0] + game_window_start_offsets[(state->zoombox.y - 1) * 8] + state->zoombox.x - 1,
                      (state->zoombox.width + 2) * 8,
                      (state->zoombox.height + 2) * 8);

    {
      /* Conv: Timing: The original game slows in proportion to the size of
       * the area being zoomboxed. We simulate that here. */
      int delay = (state->zoombox.height + state->zoombox.width) * 110951 / 35;
      state->speccy->sleep(state->speccy, delay);
    }
  }
  while (state->zoombox.height + state->zoombox.width < 35);
}